

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_table(LexState *ls,ExpDesc *e)

{
  uint uVar1;
  int iVar2;
  LexToken LVar3;
  uint uVar4;
  BCReg BVar5;
  long lVar6;
  uint *in_RSI;
  long *in_RDI;
  Node *n;
  uint32_t hmask;
  uint32_t i;
  Node *node;
  BCIns *ip;
  ExpDesc en;
  BCInsLine *ilp;
  BCReg kidx;
  TValue *v;
  TValue k;
  ExpDesc val;
  ExpDesc key;
  BCPos pc;
  BCReg freg;
  uint32_t nhash;
  uint32_t narr;
  int fixt;
  int needarr;
  int vcall;
  GCtab *t;
  BCLine line;
  FuncState *fs;
  GCobj *o;
  undefined4 in_stack_fffffffffffffe48;
  BCReg in_stack_fffffffffffffe4c;
  uint32_t in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe54;
  BCIns in_stack_fffffffffffffe58;
  BCIns in_stack_fffffffffffffe5c;
  uint32_t in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe64;
  GCobj *in_stack_fffffffffffffe68;
  FuncState *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  uint uVar7;
  int local_170 [6];
  BCInsLine *local_158;
  BCReg local_14c;
  TValue *local_148;
  TValue local_140;
  ExpDesc local_138;
  anon_union_8_3_2ce71dea_for_u local_120;
  uint local_118;
  undefined4 local_114;
  undefined4 local_110;
  BCPos local_104;
  uint local_100;
  int local_fc;
  uint32_t local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  GCtab *local_e8;
  undefined4 local_dc;
  FuncState *local_d8;
  uint *local_d0;
  long *local_c8;
  GCtab *local_c0;
  TValue *local_b8;
  lua_State *local_b0;
  undefined4 local_a4;
  GCtab *local_a0;
  TValue *local_98;
  lua_State *local_90;
  undefined4 local_84;
  GCtab *local_80;
  TValue *local_78;
  char *local_70;
  TValue *local_68;
  lua_State *local_60;
  undefined4 local_58;
  undefined4 local_54;
  int *local_50;
  undefined4 local_48;
  undefined4 local_44;
  anon_union_8_3_2ce71dea_for_u *local_40;
  uint local_38;
  undefined4 local_34;
  uint *local_30;
  uint32_t local_24;
  anon_union_8_3_2ce71dea_for_u *local_20;
  GCtab *local_18;
  GCtab *local_10;
  ulong local_8;
  
  local_d8 = (FuncState *)*in_RDI;
  local_dc = (undefined4)in_RDI[0xc];
  local_e8 = (GCtab *)0x0;
  local_ec = 0;
  local_f0 = 0;
  local_f4 = 0;
  local_f8 = 1;
  local_fc = 0;
  local_100 = local_d8->freereg;
  local_d0 = in_RSI;
  local_c8 = in_RDI;
  local_104 = bcemit_INS((FuncState *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c);
  local_30 = local_d0;
  local_34 = 0xc;
  local_38 = local_100;
  local_d0[2] = 0xc;
  *local_d0 = local_100;
  local_d0[3] = 0xffffffff;
  local_d0[4] = 0xffffffff;
  bcreg_reserve((FuncState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe4c);
  local_100 = local_100 + 1;
  lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
            in_stack_fffffffffffffe4c);
  do {
    if (*(int *)((long)local_c8 + 0x34) == 0x7d) break;
    local_ec = 0;
    if (*(int *)((long)local_c8 + 0x34) == 0x5b) {
      expr_bracket((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (4 < local_118) {
        expr_index((FuncState *)&in_stack_fffffffffffffe68->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      if ((local_118 == 4) && (iVar2 = expr_numiszero((ExpDesc *)&local_120.s), iVar2 != 0)) {
        local_f0 = 1;
      }
      else {
        local_fc = local_fc + 1;
      }
      lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe4c);
    }
    else if (((*(int *)((long)local_c8 + 0x34) == 0x11f) ||
             (*(int *)((long)local_c8 + 0x34) == 0x10a)) &&
            (LVar3 = lj_lex_lookahead((LexState *)0x14b1ff), LVar3 == 0x3d)) {
      expr_str((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (ExpDesc *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      lex_check((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe4c);
      local_fc = local_fc + 1;
    }
    else {
      local_40 = &local_120;
      local_44 = 4;
      local_48 = 0;
      local_118 = 4;
      local_114 = 0xffffffff;
      local_110 = 0xffffffff;
      local_20 = &local_120;
      local_24 = local_f8;
      local_120 = (anon_union_8_3_2ce71dea_for_u)(double)(int)local_f8;
      local_f8 = local_f8 + 1;
      local_ec = 1;
      local_f0 = 1;
    }
    expr((LexState *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
         (ExpDesc *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (((local_118 < 5) && (local_118 != 0)) &&
       ((local_118 == 3 || ((local_138.k < VKCDATA && (local_138.t == local_138.f)))))) {
      if (local_e8 == (GCtab *)0x0) {
        in_stack_fffffffffffffe68 = (GCobj *)local_d8->L;
        in_stack_fffffffffffffe60 = local_f8;
        if (local_f0 == 0) {
          in_stack_fffffffffffffe60 = 0;
        }
        if (local_fc == 0) {
          in_stack_fffffffffffffe58 = 0;
        }
        else if (local_fc == 1) {
          in_stack_fffffffffffffe58 = 1;
          in_stack_fffffffffffffe5c = in_stack_fffffffffffffe58;
        }
        else {
          iVar2 = 0x1f;
          if (local_fc - 1U != 0) {
            for (; local_fc - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          in_stack_fffffffffffffe58 = iVar2 + 1;
          in_stack_fffffffffffffe5c = in_stack_fffffffffffffe58;
        }
        in_stack_fffffffffffffe64 = in_stack_fffffffffffffe60;
        local_e8 = lj_tab_new((lua_State *)
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                              in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
        local_14c = const_gc(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             in_stack_fffffffffffffe64);
        local_d8->bcbase[local_104].ins = (local_100 - 1) * 0x100 | 0x35 | local_14c << 0x10;
      }
      local_ec = 0;
      expr_kvalue(local_d8,&local_140,(ExpDesc *)&local_120.s);
      local_148 = lj_tab_set((lua_State *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                             (GCtab *)in_stack_fffffffffffffe70,(cTValue *)in_stack_fffffffffffffe68
                            );
      if ((local_e8->marked & 4) != 0) {
        local_8 = (ulong)(local_d8->L->glref).ptr32;
        local_10 = local_e8;
        local_18 = local_e8;
        local_e8->marked = local_e8->marked & 0xfb;
        (local_e8->gclist).gcptr32 = *(uint32_t *)(local_8 + 0x6c);
        *(uint32_t *)(local_8 + 0x6c) = (uint32_t)local_e8;
      }
      if ((VKLAST < local_138.k) || (local_138.t != local_138.f)) {
        local_b0 = local_d8->L;
        local_c0 = local_e8;
        local_a0 = local_e8;
        local_a4 = 0xfffffff4;
        local_80 = local_e8;
        local_84 = 0xfffffff4;
        (local_148->u32).lo = (uint32_t)local_e8;
        (local_148->field_2).it = 0xfffffff4;
        local_70 = "store to dead GC object";
        local_f4 = 1;
        local_b8 = local_148;
        local_98 = local_148;
        local_90 = local_b0;
        local_78 = local_148;
        local_68 = local_148;
        local_60 = local_b0;
        goto LAB_0014b67a;
      }
      expr_kvalue(local_d8,local_148,&local_138);
    }
    else {
LAB_0014b67a:
      if (local_138.k != VCALL) {
        expr_toanyreg((FuncState *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                      (ExpDesc *)0x14b699);
        local_ec = 0;
      }
      if (local_118 < 5) {
        expr_index((FuncState *)&in_stack_fffffffffffffe68->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      bcemit_store(in_stack_fffffffffffffe70,(ExpDesc *)&in_stack_fffffffffffffe68->gch,
                   (ExpDesc *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
    local_d8->freereg = local_100;
    iVar2 = lex_opt((LexState *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  } while ((iVar2 != 0) ||
          (iVar2 = lex_opt((LexState *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                           ,0), iVar2 != 0));
  lex_match((LexState *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
  if (local_ec != 0) {
    local_158 = local_d8->bcbase + (local_d8->pc - 1);
    local_50 = local_170;
    local_54 = 4;
    local_58 = 0;
    local_170[2] = 4;
    local_170[3] = 0xffffffff;
    local_170[4] = 0xffffffff;
    local_170[0] = local_f8 - 1;
    local_170[1] = 0x43300000;
    if (0x100 < local_f8) {
      local_d8->pc = local_d8->pc - 1;
      local_158 = local_158 + -1;
    }
    uVar4 = local_100 << 8 | 0x3f;
    BVar5 = const_num((FuncState *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                      (ExpDesc *)(CONCAT44(local_100 << 8,in_stack_fffffffffffffe50) | 0x3f00000000)
                     );
    local_158->ins = uVar4 | BVar5 << 0x10;
    *(undefined1 *)((long)&local_158[-1].ins + 3) = 0;
  }
  if (local_104 == local_d8->pc - 1) {
    *local_d0 = local_104;
    local_d8->freereg = local_d8->freereg - 1;
    local_d0[2] = 0xb;
  }
  else {
    local_d0[2] = 0xc;
  }
  if (local_e8 == (GCtab *)0x0) {
    if (local_f0 == 0) {
      local_f8._0_2_ = 0;
    }
    else if (local_f8 < 3) {
      local_f8._0_2_ = 3;
    }
    else {
      if (0x7ff < local_f8) {
        local_f8 = 0x7ff;
      }
    }
    if (local_fc == 0) {
      iVar2 = 0;
    }
    else if (local_fc == 1) {
      iVar2 = 1;
    }
    else {
      iVar2 = 0x1f;
      if (local_fc - 1U != 0) {
        for (; local_fc - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      iVar2 = iVar2 + 1;
    }
    *(ushort *)((long)&local_d8->bcbase[local_104].ins + 2) =
         (ushort)local_f8 | (ushort)(iVar2 << 0xb);
  }
  else {
    if ((local_f0 != 0) && (local_e8->asize < local_f8)) {
      lj_tab_reasize((lua_State *)in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->tab,
                     in_stack_fffffffffffffe64);
    }
    if (local_f4 != 0) {
      uVar4 = (local_e8->node).ptr32;
      uVar1 = local_e8->hmask;
      for (uVar7 = 0; uVar7 <= uVar1; uVar7 = uVar7 + 1) {
        lVar6 = (ulong)uVar4 + (ulong)uVar7 * 0x18;
        if (*(int *)(lVar6 + 4) == -0xc) {
          *(undefined4 *)(lVar6 + 4) = 0xffffffff;
        }
      }
    }
    if (*(uint *)((ulong)(local_d8->L->glref).ptr32 + 0x54) <=
        *(uint *)((ulong)(local_d8->L->glref).ptr32 + 0x50)) {
      lj_gc_step((lua_State *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->tok != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->tok == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(fs, &k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(fs, v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lj_assertFS(bc_a(ilp->ins) == freg &&
		bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB),
		"bad CALL code generation");
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lj_assertFS(tabV(&n->val) == t, "bad dummy key in template table");
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}